

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O1

char * srcdir_path(char *file)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = getenv("srcdir");
  if (0x1f < srcdir_path::curpath) {
    srcdir_path_cold_1();
  }
  lVar2 = (long)srcdir_path::curpath;
  if (lVar2 < 0x20) {
    srcdir_path::filepath[lVar2][0xfff] = '\0';
    if (pcVar1 == (char *)0x0) {
      snprintf(srcdir_path::filepath[lVar2],0xfff,"%s",file);
    }
    else {
      snprintf(srcdir_path::filepath[lVar2],0xfff,"%s/%s",pcVar1,file);
    }
    lVar2 = (long)srcdir_path::curpath;
    srcdir_path::curpath = srcdir_path::curpath + 1;
    return srcdir_path::filepath[lVar2];
  }
  __assert_fail("curpath < NUMPATHS",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/tests/session_fixture.c"
                ,0x109,"const char *srcdir_path(const char *)");
}

Assistant:

const char *srcdir_path(const char *file)
{
#ifdef _WIN32
    static char filepath[NUMPATHS][_MAX_PATH];
#else
    static char filepath[NUMPATHS][MAXPATHLEN];
#endif
    static int curpath;
    char *p = getenv("srcdir");
    if(curpath >= NUMPATHS) {
        fprintf(stderr, "srcdir_path ran out of filepath slots.\n");
    }
    assert(curpath < NUMPATHS);
    if(p) {
        /* Ensure the final string is nul-terminated on Windows */
        filepath[curpath][sizeof(filepath[0]) - 1] = 0;
        snprintf(filepath[curpath], sizeof(filepath[0]) - 1, "%s/%s",
                 p, file);
    }
    else {
        /* Ensure the final string is nul-terminated on Windows */
        filepath[curpath][sizeof(filepath[0]) - 1] = 0;
        snprintf(filepath[curpath], sizeof(filepath[0]) - 1, "%s",
                 file);
    }

    return filepath[curpath++];
}